

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

ssize_t __thiscall parser::state::read(state *this,int __fd,void *__buf,size_t __nbytes)

{
  stream_type *psVar1;
  long lVar2;
  _Map_pointer ppcVar3;
  ind iVar4;
  _Elt_pointer pcVar5;
  _Elt_pointer pcVar6;
  _Elt_pointer puVar7;
  long lVar8;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined4 in_register_00000034;
  long lVar9;
  char *__first;
  undefined8 uStack_80;
  const_iterator local_78;
  iterator local_58;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  lVar8 = -(CONCAT44(in_register_00000034,__fd) + 0xfU & 0xfffffffffffffff0);
  __first = (char *)((long)&local_78 + lVar8);
  psVar1 = this->in;
  *(undefined8 *)((long)&uStack_80 + lVar8) = 0x1307ad;
  std::istream::read((char *)psVar1,(long)__first);
  lVar2 = *(long *)(this->in + 8);
  local_78._M_cur =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  local_78._M_first =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  local_78._M_node =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  if (lVar2 != 0) {
    ppcVar3 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    iVar4 = (this->off).i;
    local_38 = &this->lines;
    pcVar5 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    pcVar6 = (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    lVar9 = 0;
    do {
      this_00 = local_38;
      if (__first[lVar9] == '\n') {
        local_58._M_cur =
             pcVar5 + iVar4 + (long)local_78._M_cur +
             lVar9 + ((((((ulong)((long)local_78._M_node - (long)ppcVar3) >> 3) - 1) +
                       (ulong)(local_78._M_node == (_Map_pointer)0x0)) * 0x200 - (long)pcVar6) -
                     (long)local_78._M_first) + 1;
        puVar7 = (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (puVar7 == (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          *(undefined8 *)((long)&uStack_80 + lVar8) = 0x13084d;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
                    (this_00,(unsigned_long *)&local_58);
        }
        else {
          *puVar7 = (unsigned_long)local_58._M_cur;
          (this->lines).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur = puVar7 + 1;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar2 != lVar9);
    local_78._M_cur =
         (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur;
    local_78._M_first =
         (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_first;
    local_78._M_node =
         (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_node;
  }
  local_78._M_last =
       (this->str).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  *(undefined8 *)((long)&uStack_80 + lVar8) = 0x13088f;
  std::deque<char,std::allocator<char>>::insert<char*,void>
            (&local_58,(deque<char,std::allocator<char>> *)&this->str,&local_78,__first,
             __first + lVar2);
  return lVar2;
}

Assistant:

ind read(ind n) {
			value_type s[n];
			// Read into buffer
			in.read(s, n);
			// Count read characters
			ind r = in.gcount();
			// Track newlines
			ind i_max = off.i + str.size();
			for (ind i = 0; i < r; ++i) {
				if ( s[i] == '\n' ) { lines.push_back(i_max + i + 1); }
			}
			// Add to stored input
			str.insert(str.end(), s, s+r);
			return r;
		}